

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O1

void __thiscall
GraphViewer::initialize(GraphViewer *this,int width,int height,bool dynamic,int port_n)

{
  __pid_t __pid;
  Connection *pCVar1;
  size_t sVar2;
  char *pcVar3;
  string command;
  string str;
  string port_string;
  stringstream ss;
  char buff [200];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0;
  long local_2d8;
  long local_2d0 [2];
  string local_2c0;
  long *local_2a0;
  long local_290 [2];
  stringstream local_280 [16];
  ostream local_270 [112];
  ios_base local_200 [264];
  char local_f8 [200];
  
  this->width = width;
  this->height = height;
  this->isDynamic = dynamic;
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_300,"java -jar ../src/GraphViewer/GraphViewerController.jar","");
  std::__cxx11::stringstream::stringstream(local_280);
  std::ostream::operator<<(local_270,port_n);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((char *)local_300);
  std::__cxx11::string::_M_append((char *)local_300,(ulong)local_2a0);
  procId = fork();
  if (procId != 0) {
    usleep(2000000);
    pCVar1 = (Connection *)operator_new(4);
    Connection::Connection(pCVar1,(short)port_n);
    this->con = pCVar1;
    pcVar3 = "false";
    if (dynamic) {
      pcVar3 = "true";
    }
    sprintf(local_f8,"newGraph %d %d %s\n",(ulong)(uint)width,(ulong)(uint)height,pcVar3);
    local_2e0 = local_2d0;
    sVar2 = strlen(local_f8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,local_f8,local_f8 + sVar2);
    pCVar1 = this->con;
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c0,local_2e0,local_2d8 + (long)local_2e0);
    Connection::sendMsg(pCVar1,&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_2e0 != local_2d0) {
      operator_delete(local_2e0,local_2d0[0] + 1);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_280);
    std::ios_base::~ios_base(local_200);
    if (local_300[0] != local_2f0) {
      operator_delete(local_300[0],local_2f0[0] + 1);
    }
    return;
  }
  system((char *)local_300[0]);
  __pid = getppid();
  kill(__pid,2);
  exit(0);
}

Assistant:

void GraphViewer::initialize(int width, int height, bool dynamic, int port_n) {
	this->width = width;
	this->height = height;
	this->isDynamic = dynamic;
	string command = "java -jar ../src/GraphViewer/GraphViewerController.jar";
	std::stringstream ss;
	ss << port_n;
	string port_string = ss.str();
	command += " --port ";
	command += port_string;

#if defined(__linux__) || defined(__APPLE__)
	if (!(procId = fork())) {
		system(command.c_str());
		kill(getppid(), SIGINT);
		exit(0);
	}
	else {
		usleep(2000000);
		con = new Connection(port_n);

		char buff[200];
		sprintf(buff, "newGraph %d %d %s\n", width, height, (dynamic?"true":"false"));
		string str(buff);
		con->sendMsg(str);
	}
#else
	STARTUPINFO si;
	PROCESS_INFORMATION pi;
	ZeroMemory( &si, sizeof(si) );
	si.cb = sizeof(si);
	ZeroMemory( &pi, sizeof(pi) );
	LPSTR command_lpstr = const_cast<char *>(command.c_str());
	if( !CreateProcess( NULL,   // No module name (use command line)
			command_lpstr,        // Command line
			NULL,           // Process handle not inheritable
			NULL,           // Thread handle not inheritable
			FALSE,          // Set handle inheritance to FALSE
			0,              // No creation flags
			NULL,           // Use parent's environment block
			NULL,           // Use parent's starting directory
			&si,            // Pointer to STARTUPINFO structure
			&pi )           // Pointer to PROCESS_INFORMATION structure
	) {
		cerr << "CreateProcess failed " << GetLastError() << endl;
		return;
	}

	// Close process and thread handles.
	CloseHandle( pi.hProcess );
	CloseHandle( pi.hThread );

	Sleep(2000);
	con = new Connection(port_n);

	char buff[200];
	sprintf(buff, "newGraph %d %d %s\n", width, height, (dynamic?"true":"false"));
	string str(buff);
	con->sendMsg(str);
#endif

}